

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  Options OVar4;
  bool bVar5;
  byte bVar6;
  _Ios_Openmode _Var7;
  element_type *peVar8;
  size_t sVar9;
  ostream *poVar10;
  size_type sVar11;
  ulong uVar12;
  undefined8 uVar13;
  BPELearner *this;
  int *piVar14;
  SentencePieceLearner *this_00;
  bool *pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar17;
  char *__s;
  string outputFileName;
  ofstream outputFile;
  ostream *pCout;
  ifstream inputFile;
  string *inputFileName;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ParseResult subvm;
  int i;
  char **subargv;
  int subargc;
  Options bpe_options;
  value_type *subword;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subword_args;
  SubwordLearner *learner;
  Tokenizer tokenizer;
  ParseResult vm;
  Options cmd_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe508;
  Options *in_stack_ffffffffffffe510;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe518;
  ostream *in_stack_ffffffffffffe520;
  undefined7 in_stack_ffffffffffffe528;
  undefined1 in_stack_ffffffffffffe52f;
  string *in_stack_ffffffffffffe530;
  ParseResult *in_stack_ffffffffffffe538;
  ParseResult *in_stack_ffffffffffffe540;
  ParseResult *this_01;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffe548;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffe550;
  OptionValue *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe558;
  string *in_stack_ffffffffffffe560;
  Options *in_stack_ffffffffffffe568;
  undefined6 in_stack_ffffffffffffe570;
  undefined1 in_stack_ffffffffffffe576;
  undefined1 in_stack_ffffffffffffe577;
  undefined8 in_stack_ffffffffffffe578;
  string *in_stack_ffffffffffffe580;
  string *in_stack_ffffffffffffe588;
  Options *in_stack_ffffffffffffe590;
  undefined8 in_stack_ffffffffffffe598;
  undefined8 in_stack_ffffffffffffe5a0;
  string *in_stack_ffffffffffffe5a8;
  Options *in_stack_ffffffffffffe5b0;
  char **in_stack_ffffffffffffe5d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe5e0;
  undefined7 in_stack_ffffffffffffe5e8;
  undefined1 in_stack_ffffffffffffe5ef;
  string *in_stack_ffffffffffffe680;
  shared_ptr<const_cxxopts::Value> *in_stack_ffffffffffffe688;
  string *in_stack_ffffffffffffe690;
  undefined7 in_stack_ffffffffffffe698;
  undefined1 in_stack_ffffffffffffe69f;
  OptionAdder *in_stack_ffffffffffffe6a0;
  undefined1 local_16d1 [33];
  string local_16b0 [39];
  undefined1 local_1689 [33];
  char local_1668 [320];
  ParseResult *in_stack_ffffffffffffead8;
  char *local_1468;
  undefined8 local_1460;
  undefined8 local_1458;
  char local_1450 [520];
  reference local_1248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1240;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1238;
  allocator<char> local_1229;
  string local_1228 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1208;
  allocator<char> local_11f9;
  string local_11f8 [38];
  undefined1 local_11d2;
  allocator<char> local_11d1;
  string local_11d0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_11a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_11a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1198;
  vector local_1190 [31];
  allocator<char> local_1171;
  string local_1170 [38];
  undefined1 local_114a;
  allocator<char> local_1149;
  string local_1148 [39];
  allocator<char> local_1121;
  string local_1120 [39];
  allocator<char> local_10f9;
  string local_10f8 [39];
  allocator<char> local_10d1;
  string local_10d0 [39];
  allocator<char> local_10a9;
  string local_10a8 [32];
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  string local_1070 [39];
  allocator<char> local_1049;
  string local_1048 [196];
  int local_f84;
  void *local_f80;
  int local_f78;
  allocator<char> local_f71;
  string local_f70 [39];
  allocator<char> local_f49;
  string local_f48 [48];
  undefined1 local_f18 [39];
  allocator<char> local_ef1;
  string local_ef0 [39];
  allocator<char> local_ec9;
  string local_ec8 [39];
  allocator<char> local_ea1;
  string local_ea0 [39];
  allocator<char> local_e79;
  string local_e78 [48];
  undefined1 local_e48 [39];
  allocator<char> local_e21;
  string local_e20 [39];
  allocator<char> local_df9;
  string local_df8 [39];
  allocator<char> local_dd1;
  string local_dd0 [39];
  allocator<char> local_da9;
  string local_da8 [48];
  undefined1 local_d78 [39];
  allocator<char> local_d51;
  string local_d50 [39];
  allocator<char> local_d29;
  string local_d28 [39];
  allocator<char> local_d01;
  string local_d00 [39];
  allocator<char> local_cd9;
  string local_cd8 [48];
  undefined1 local_ca8 [39];
  allocator<char> local_c81;
  string local_c80 [39];
  allocator<char> local_c59;
  string local_c58 [39];
  allocator<char> local_c31;
  string local_c30 [71];
  allocator<char> local_be9;
  string local_be8 [39];
  allocator<char> local_bc1;
  string local_bc0 [39];
  allocator<char> local_b99;
  string local_b98 [79];
  allocator<char> local_b49;
  string local_b48 [39];
  allocator<char> local_b21;
  string local_b20 [408];
  const_reference local_988;
  allocator<char> local_979;
  string local_978 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_958;
  BPELearner *local_940;
  shared_ptr local_928 [168];
  Tokenizer local_880 [196];
  uint local_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  string local_798 [39];
  allocator<char> local_771;
  string local_770 [199];
  allocator<char> local_6a9;
  string local_6a8 [39];
  allocator<char> local_681;
  string local_680 [71];
  allocator<char> local_639;
  string local_638 [39];
  allocator<char> local_611;
  string local_610 [39];
  allocator<char> local_5e9;
  string local_5e8 [39];
  allocator<char> local_5c1;
  Options *in_stack_fffffffffffffa40;
  undefined1 local_590 [39];
  allocator<char> local_569;
  string local_568 [39];
  allocator<char> local_541;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [71];
  allocator<char> local_4d1;
  string local_4d0 [39];
  allocator<char> local_4a9;
  string local_4a8 [39];
  allocator<char> local_481;
  string local_480 [71];
  allocator<char> local_439;
  string local_438 [39];
  allocator<char> local_411;
  string local_410 [39];
  allocator<char> local_3e9;
  string local_3e8 [79];
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [48];
  undefined1 local_340 [39];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [71];
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [79];
  allocator<char> local_1e1;
  string local_1e0 [55];
  allocator<char> local_1a9;
  string local_1a8 [420];
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::Options::Options
            (in_stack_ffffffffffffe590,in_stack_ffffffffffffe588,in_stack_ffffffffffffe580);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::Options::add_options(in_stack_ffffffffffffe568,in_stack_ffffffffffffe560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
             (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::OptionAdder::operator()
            (in_stack_ffffffffffffe6a0,
             (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
             in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::value<bool>();
  peVar8 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11cea2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  (*peVar8->_vptr_Value[10])(local_340,peVar8,local_370);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
             (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::OptionAdder::operator()
            (in_stack_ffffffffffffe6a0,
             (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
             in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11cf9e);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11cfab);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11cfd2);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11d02d);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11d03a);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x11d07b);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  add_tokenization_options(in_stack_fffffffffffffa40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::Options::add_options(in_stack_ffffffffffffe568,in_stack_ffffffffffffe560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
             (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::OptionAdder::operator()
            (in_stack_ffffffffffffe6a0,
             (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
             in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
             (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::OptionAdder::operator()
            (in_stack_ffffffffffffe6a0,
             (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
             in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::value<std::__cxx11::string>();
  peVar8 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11d360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  (*peVar8->_vptr_Value[10])(local_590,peVar8,&stack0xfffffffffffffa40);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
             (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::OptionAdder::operator()
            (in_stack_ffffffffffffe6a0,
             (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
             in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
             (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::OptionAdder::operator()
            (in_stack_ffffffffffffe6a0,
             (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
             in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator(&local_681);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11d550);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11d55d);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator(&local_611);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11d5b8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11d5c5);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffa40);
  std::allocator<char>::~allocator(&local_5c1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11d5ec);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11d647);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11d654);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11d6af);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11d6bc);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x11d6fd);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::Options::parse_positional(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  cxxopts::Options::parse
            ((Options *)CONCAT17(in_stack_ffffffffffffe5ef,in_stack_ffffffffffffe5e8),
             (int)((ulong)in_stack_ffffffffffffe5e0 >> 0x20),in_stack_ffffffffffffe5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  sVar9 = cxxopts::ParseResult::count(in_stack_ffffffffffffe538,in_stack_ffffffffffffe530);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator(&local_771);
  if (sVar9 != 0) {
    local_7b8 = 0;
    uStack_7b0 = 0;
    local_7a8 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x11d84b);
    cxxopts::Options::help
              ((Options *)CONCAT17(in_stack_ffffffffffffe5ef,in_stack_ffffffffffffe5e8),
               in_stack_ffffffffffffe5e0);
    poVar10 = std::operator<<((ostream *)&std::cout,local_798);
    std::ostream::operator<<((ostream *)poVar10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_798);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffe520);
    local_4 = 0;
    local_7bc = 1;
    goto LAB_00120792;
  }
  build_tokenization_options(in_stack_ffffffffffffead8);
  std::shared_ptr<const_onmt::SubwordEncoder>::shared_ptr
            ((shared_ptr<const_onmt::SubwordEncoder> *)in_stack_ffffffffffffe510,
             in_stack_ffffffffffffe508);
  OVar4.lang._0_8_ = in_stack_ffffffffffffe510;
  OVar4._0_8_ = in_stack_ffffffffffffe508;
  OVar4.lang._M_string_length = (size_type)in_stack_ffffffffffffe518;
  OVar4.lang.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe520;
  OVar4.lang.field_2._8_7_ = in_stack_ffffffffffffe528;
  OVar4.lang.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe52f;
  OVar4._40_8_ = in_stack_ffffffffffffe530;
  OVar4.joiner._0_8_ = in_stack_ffffffffffffe538;
  OVar4.joiner._M_string_length = (size_type)in_stack_ffffffffffffe540;
  OVar4.joiner.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548._M_current;
  OVar4.joiner.field_2._8_8_ = in_stack_ffffffffffffe550._M_current;
  OVar4._80_8_ = in_stack_ffffffffffffe558;
  OVar4.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = in_stack_ffffffffffffe560;
  OVar4.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = &in_stack_ffffffffffffe568->m_program;
  OVar4.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = in_stack_ffffffffffffe570;
  OVar4.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = in_stack_ffffffffffffe576;
  OVar4.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = in_stack_ffffffffffffe577;
  OVar4.segment_alphabet_codes._M_h._M_buckets = (__buckets_ptr)in_stack_ffffffffffffe578;
  OVar4.segment_alphabet_codes._M_h._M_bucket_count = (size_type)in_stack_ffffffffffffe580;
  OVar4.segment_alphabet_codes._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)in_stack_ffffffffffffe588;
  OVar4.segment_alphabet_codes._M_h._M_element_count = (size_type)in_stack_ffffffffffffe590;
  OVar4.segment_alphabet_codes._M_h._M_rehash_policy._0_8_ = in_stack_ffffffffffffe598;
  OVar4.segment_alphabet_codes._M_h._M_rehash_policy._M_next_resize = in_stack_ffffffffffffe5a0;
  OVar4.segment_alphabet_codes._M_h._M_single_bucket = (__node_base_ptr)in_stack_ffffffffffffe5a8;
  onmt::Tokenizer::Tokenizer(local_880,OVar4,local_928);
  std::shared_ptr<const_onmt::SubwordEncoder>::~shared_ptr
            ((shared_ptr<const_onmt::SubwordEncoder> *)0x11e152);
  onmt::Tokenizer::Options::~Options((Options *)in_stack_ffffffffffffe510);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
             (allocator<char> *)in_stack_ffffffffffffe540);
  cxxopts::ParseResult::operator[](in_stack_ffffffffffffe540,(string *)in_stack_ffffffffffffe538);
  cxxopts::OptionValue::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((OptionValue *)in_stack_ffffffffffffe550._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe560,in_stack_ffffffffffffe558);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator(&local_979);
  local_988 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_958,0);
  bVar5 = std::operator==(&in_stack_ffffffffffffe510->m_program,(char *)in_stack_ffffffffffffe508);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::Options::Options
              (in_stack_ffffffffffffe590,in_stack_ffffffffffffe588,in_stack_ffffffffffffe580);
    std::__cxx11::string::~string(local_b48);
    std::allocator<char>::~allocator(&local_b49);
    std::__cxx11::string::~string(local_b20);
    std::allocator<char>::~allocator(&local_b21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::Options::add_options(in_stack_ffffffffffffe568,in_stack_ffffffffffffe560);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::value<bool>();
    std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
              ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
               (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::OptionAdder::operator()
              (in_stack_ffffffffffffe6a0,
               (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
               in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::value<int>();
    peVar8 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11e4c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    (*peVar8->_vptr_Value[10])(local_ca8,peVar8,local_cd8);
    std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
              ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
               (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::OptionAdder::operator()
              (in_stack_ffffffffffffe6a0,
               (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
               in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::value<int>();
    peVar8 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11e61f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    (*peVar8->_vptr_Value[10])(local_d78,peVar8,local_da8);
    std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
              ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
               (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::OptionAdder::operator()
              (in_stack_ffffffffffffe6a0,
               (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
               in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::value<bool>();
    peVar8 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11e77e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    (*peVar8->_vptr_Value[10])(local_e48,peVar8,local_e78);
    std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
              ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
               (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::OptionAdder::operator()
              (in_stack_ffffffffffffe6a0,
               (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
               in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::value<bool>();
    peVar8 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11e8dd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    (*peVar8->_vptr_Value[10])(local_f18,peVar8,local_f48);
    std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
              ((shared_ptr<const_cxxopts::Value> *)in_stack_ffffffffffffe510,
               (shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffe508);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    cxxopts::OptionAdder::operator()
              (in_stack_ffffffffffffe6a0,
               (string *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
               in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680);
    std::__cxx11::string::~string(local_f70);
    std::allocator<char>::~allocator(&local_f71);
    std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11e9d9)
    ;
    std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11e9e6);
    std::__cxx11::string::~string(local_f48);
    std::allocator<char>::~allocator(&local_f49);
    std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11ea0d);
    std::__cxx11::string::~string(local_ef0);
    std::allocator<char>::~allocator(&local_ef1);
    std::__cxx11::string::~string(local_ec8);
    std::allocator<char>::~allocator(&local_ec9);
    std::__cxx11::string::~string(local_ea0);
    std::allocator<char>::~allocator(&local_ea1);
    std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11ea68)
    ;
    std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11ea75);
    std::__cxx11::string::~string(local_e78);
    std::allocator<char>::~allocator(&local_e79);
    std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11ea9c);
    std::__cxx11::string::~string(local_e20);
    std::allocator<char>::~allocator(&local_e21);
    std::__cxx11::string::~string(local_df8);
    std::allocator<char>::~allocator(&local_df9);
    std::__cxx11::string::~string(local_dd0);
    std::allocator<char>::~allocator(&local_dd1);
    std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11eaf7)
    ;
    std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11eb04);
    std::__cxx11::string::~string(local_da8);
    std::allocator<char>::~allocator(&local_da9);
    std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11eb2b);
    std::__cxx11::string::~string(local_d50);
    std::allocator<char>::~allocator(&local_d51);
    std::__cxx11::string::~string(local_d28);
    std::allocator<char>::~allocator(&local_d29);
    std::__cxx11::string::~string(local_d00);
    std::allocator<char>::~allocator(&local_d01);
    std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11eb86)
    ;
    std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11eb93);
    std::__cxx11::string::~string(local_cd8);
    std::allocator<char>::~allocator(&local_cd9);
    std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11ebba);
    std::__cxx11::string::~string(local_c80);
    std::allocator<char>::~allocator(&local_c81);
    std::__cxx11::string::~string(local_c58);
    std::allocator<char>::~allocator(&local_c59);
    std::__cxx11::string::~string(local_c30);
    std::allocator<char>::~allocator(&local_c31);
    std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x11ec15)
    ;
    std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x11ec22);
    std::__cxx11::string::~string(local_be8);
    std::allocator<char>::~allocator(&local_be9);
    std::__cxx11::string::~string(local_bc0);
    std::allocator<char>::~allocator(&local_bc1);
    cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x11ec63);
    std::__cxx11::string::~string(local_b98);
    std::allocator<char>::~allocator(&local_b99);
    sVar11 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&local_958);
    local_f78 = (int)sVar11;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)local_f78;
    uVar12 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    local_f80 = operator_new__(uVar12);
    for (local_f84 = 0; local_f84 < local_f78; local_f84 = local_f84 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_958,(long)local_f84);
      uVar13 = std::__cxx11::string::c_str();
      *(undefined8 *)((long)local_f80 + (long)local_f84 * 8) = uVar13;
    }
    cxxopts::Options::parse
              ((Options *)CONCAT17(in_stack_ffffffffffffe5ef,in_stack_ffffffffffffe5e8),
               (int)((ulong)in_stack_ffffffffffffe5e0 >> 0x20),in_stack_ffffffffffffe5d8);
    if (local_f80 != (void *)0x0) {
      operator_delete__(local_f80);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
               (allocator<char> *)in_stack_ffffffffffffe540);
    sVar9 = cxxopts::ParseResult::count(in_stack_ffffffffffffe538,in_stack_ffffffffffffe530);
    std::__cxx11::string::~string(local_1048);
    std::allocator<char>::~allocator(&local_1049);
    if (sVar9 == 0) {
      this = (BPELearner *)operator_new(0x68);
      local_114a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
                 (allocator<char> *)in_stack_ffffffffffffe540);
      cxxopts::ParseResult::operator[]
                (in_stack_ffffffffffffe540,(string *)in_stack_ffffffffffffe538);
      pbVar15 = cxxopts::OptionValue::as<bool>((OptionValue *)in_stack_ffffffffffffe550._M_current);
      bVar6 = *pbVar15;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
                 (allocator<char> *)in_stack_ffffffffffffe540);
      cxxopts::ParseResult::operator[]
                (in_stack_ffffffffffffe540,(string *)in_stack_ffffffffffffe538);
      piVar14 = cxxopts::OptionValue::as<int>((OptionValue *)in_stack_ffffffffffffe550._M_current);
      iVar1 = *piVar14;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
                 (allocator<char> *)in_stack_ffffffffffffe540);
      cxxopts::ParseResult::operator[]
                (in_stack_ffffffffffffe540,(string *)in_stack_ffffffffffffe538);
      piVar14 = cxxopts::OptionValue::as<int>((OptionValue *)in_stack_ffffffffffffe550._M_current);
      iVar2 = *piVar14;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
                 (allocator<char> *)in_stack_ffffffffffffe540);
      cxxopts::ParseResult::operator[]
                (in_stack_ffffffffffffe540,(string *)in_stack_ffffffffffffe538);
      pbVar15 = cxxopts::OptionValue::as<bool>((OptionValue *)in_stack_ffffffffffffe550._M_current);
      bVar5 = *pbVar15;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
                 (allocator<char> *)in_stack_ffffffffffffe540);
      cxxopts::ParseResult::operator[]
                (in_stack_ffffffffffffe540,(string *)in_stack_ffffffffffffe538);
      pbVar15 = cxxopts::OptionValue::as<bool>((OptionValue *)in_stack_ffffffffffffe550._M_current);
      onmt::BPELearner::BPELearner
                (this,(bool)(bVar6 & 1),iVar1,iVar2,(bool)(bVar5 & 1),(bool)(*pbVar15 & 1));
      local_114a = 0;
      local_940 = this;
      std::__cxx11::string::~string(local_1148);
      std::allocator<char>::~allocator(&local_1149);
      std::__cxx11::string::~string(local_1120);
      std::allocator<char>::~allocator(&local_1121);
      std::__cxx11::string::~string(local_10f8);
      std::allocator<char>::~allocator(&local_10f9);
      std::__cxx11::string::~string(local_10d0);
      std::allocator<char>::~allocator(&local_10d1);
      std::__cxx11::string::~string(local_10a8);
      std::allocator<char>::~allocator(&local_10a9);
    }
    else {
      local_1088 = 0;
      uStack_1080 = 0;
      local_1078 = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x11f597);
      cxxopts::Options::help
                ((Options *)CONCAT17(in_stack_ffffffffffffe5ef,in_stack_ffffffffffffe5e8),
                 in_stack_ffffffffffffe5e0);
      poVar10 = std::operator<<((ostream *)&std::cout,local_1070);
      std::ostream::operator<<((ostream *)poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1070);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffe520);
      local_4 = 0;
    }
    local_7bc = (uint)(sVar9 != 0);
    cxxopts::ParseResult::~ParseResult((ParseResult *)in_stack_ffffffffffffe510);
    cxxopts::Options::~Options(in_stack_ffffffffffffe510);
    if (local_7bc == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
                 (allocator<char> *)in_stack_ffffffffffffe540);
      sVar9 = cxxopts::ParseResult::count(in_stack_ffffffffffffe538,in_stack_ffffffffffffe530);
      std::__cxx11::string::~string(local_11f8);
      std::allocator<char>::~allocator(&local_11f9);
      if (sVar9 == 0) {
        (**(code **)(*(long *)local_940 + 0x28))(local_940,&std::cin,local_880);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current
                   ,(allocator<char> *)in_stack_ffffffffffffe540);
        cxxopts::ParseResult::operator[]
                  (in_stack_ffffffffffffe540,(string *)in_stack_ffffffffffffe538);
        pvVar17 = cxxopts::OptionValue::
                  as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((OptionValue *)in_stack_ffffffffffffe550._M_current);
        std::__cxx11::string::~string(local_1228);
        std::allocator<char>::~allocator(&local_1229);
        local_1208 = pvVar17;
        local_1238._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_ffffffffffffe508);
        local_1240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(in_stack_ffffffffffffe508);
        while (bVar5 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffe510,
                                  (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffe508), bVar5) {
          local_1248 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_1238);
          poVar10 = std::operator<<((ostream *)&std::cerr,"Parsing ");
          poVar10 = std::operator<<(poVar10,(string *)local_1248);
          poVar10 = std::operator<<(poVar10,"...");
          std::ostream::operator<<((ostream *)poVar10,std::endl<char,std::char_traits<char>>);
          std::ifstream::ifstream(local_1450);
          _Var7 = std::__cxx11::string::c_str();
          std::ifstream::open(local_1450,_Var7);
          std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)in_stack_ffffffffffffe510,
                     (streamoff)in_stack_ffffffffffffe508);
          std::istream::seekg(local_1450,local_1460,local_1458);
          bVar6 = std::ios::fail();
          if (((bVar6 & 1) == 0) && (bVar6 = std::ios::good(), (bVar6 & 1) != 0)) {
            (**(code **)(*(long *)local_940 + 0x28))(local_940,local_1450,local_880);
            local_7bc = 0;
          }
          else {
            poVar10 = std::operator<<((ostream *)&std::cout,"ERROR: cannot open file ");
            poVar10 = std::operator<<(poVar10,(string *)local_1248);
            poVar10 = std::operator<<(poVar10," for reading ");
            std::ostream::operator<<((ostream *)poVar10,std::endl<char,std::char_traits<char>>);
            local_4 = 1;
            local_7bc = 1;
          }
          std::ifstream::~ifstream(local_1450);
          if (local_7bc != 0) goto LAB_0012075a;
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_1238);
        }
      }
      local_1468 = (char *)&std::cout;
      std::ofstream::ofstream(local_1668);
      this_02 = (OptionValue *)local_1689;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                 (char *)in_stack_ffffffffffffe548._M_current,
                 (allocator<char> *)in_stack_ffffffffffffe540);
      __s = (char *)cxxopts::ParseResult::count(in_stack_ffffffffffffe538,in_stack_ffffffffffffe530)
      ;
      std::__cxx11::string::~string((string *)(local_1689 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1689);
      if (__s == (char *)0x0) {
LAB_001206ea:
        (**(code **)(*(long *)local_940 + 0x30))
                  (local_940,local_1468,"Generated with subword_learn cli",0);
        local_4 = 0;
        local_7bc = 1;
      }
      else {
        this_01 = (ParseResult *)local_16d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,__s,
                   (allocator<char> *)this_01);
        cxxopts::ParseResult::operator[](this_01,(string *)in_stack_ffffffffffffe538);
        pbVar16 = cxxopts::OptionValue::as<std::__cxx11::string>(this_02);
        std::__cxx11::string::string(local_16b0,(string *)pbVar16);
        std::__cxx11::string::~string((string *)(local_16d1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_16d1);
        _Var7 = std::__cxx11::string::c_str();
        std::ofstream::open(local_1668,_Var7);
        bVar6 = std::ios::fail();
        bVar5 = (bVar6 & 1) != 0;
        if (bVar5) {
          in_stack_ffffffffffffe520 =
               std::operator<<((ostream *)&std::cout,"ERROR: cannot open file ");
          poVar10 = std::operator<<(in_stack_ffffffffffffe520,local_16b0);
          in_stack_ffffffffffffe510 = (Options *)std::operator<<(poVar10," for writing ");
          std::ostream::operator<<
                    ((ostream *)in_stack_ffffffffffffe510,std::endl<char,std::char_traits<char>>);
          local_4 = 1;
        }
        else {
          local_1468 = local_1668;
        }
        local_7bc = (uint)bVar5;
        std::__cxx11::string::~string(local_16b0);
        if (local_7bc == 0) goto LAB_001206ea;
      }
      std::ofstream::~ofstream(local_1668);
    }
  }
  else {
    bVar5 = std::operator==(&in_stack_ffffffffffffe510->m_program,(char *)in_stack_ffffffffffffe508)
    ;
    if (bVar5) {
      this_00 = (SentencePieceLearner *)operator_new(0x78);
      local_11d2 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
                 (allocator<char> *)in_stack_ffffffffffffe540);
      cxxopts::ParseResult::operator[]
                (in_stack_ffffffffffffe540,(string *)in_stack_ffffffffffffe538);
      pbVar15 = cxxopts::OptionValue::as<bool>((OptionValue *)in_stack_ffffffffffffe550._M_current);
      bVar6 = *pbVar15;
      local_11a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(in_stack_ffffffffffffe508);
      local_1198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator+(in_stack_ffffffffffffe518,(difference_type)in_stack_ffffffffffffe510)
      ;
      local_11a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(in_stack_ffffffffffffe508);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x11fd28);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe540,in_stack_ffffffffffffe550,in_stack_ffffffffffffe548,
                 (allocator_type *)in_stack_ffffffffffffe538);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe550._M_current,(char *)in_stack_ffffffffffffe548._M_current,
                 (allocator<char> *)in_stack_ffffffffffffe540);
      cxxopts::ParseResult::operator[]
                (in_stack_ffffffffffffe540,(string *)in_stack_ffffffffffffe538);
      pbVar16 = cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_ffffffffffffe550._M_current)
      ;
      onmt::SentencePieceLearner::SentencePieceLearner
                (this_00,(bool)(bVar6 & 1),local_1190,(string *)pbVar16,false,false);
      local_11d2 = 0;
      local_940 = (BPELearner *)this_00;
      std::__cxx11::string::~string(local_11d0);
      std::allocator<char>::~allocator(&local_11d1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffe520);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x11fe36);
      std::__cxx11::string::~string(local_1170);
      std::allocator<char>::~allocator(&local_1171);
      local_4 = 1;
      local_7bc = 1;
    }
    else {
      poVar10 = std::operator<<((ostream *)&std::cerr,"ERROR: invalid subword type: ");
      poVar10 = std::operator<<(poVar10,(string *)local_988);
      poVar10 = std::operator<<(poVar10," (accepted: bpe, sentencepiece)");
      std::ostream::operator<<((ostream *)poVar10,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
      local_7bc = 1;
    }
  }
LAB_0012075a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffe520);
  onmt::Tokenizer::~Tokenizer((Tokenizer *)in_stack_ffffffffffffe510);
LAB_00120792:
  cxxopts::ParseResult::~ParseResult((ParseResult *)in_stack_ffffffffffffe510);
  cxxopts::Options::~Options(in_stack_ffffffffffffe510);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  cxxopts::Options cmd_options("subword_learn",
                               "Subword learning script.\n\nsubword_learn "
                               "[TOKENIZATION_OPTIONS...] -- [SUBWORD_TYPE] "
                               "[SUBWORD_OPTIONS...] < input_file > output_file\n");
  cmd_options.add_options()
    ("h,help", "Show this help")
    ("v,verbose", "Enable verbose output",
     cxxopts::value<bool>()->default_value("false"))
    ;

  add_tokenization_options(cmd_options);

  cmd_options.add_options("Subword learning")
    ("i,input", "Input files (if not set, the standard input is used)",
     cxxopts::value<std::vector<std::string>>())
    ("o,output", "Output file (if not set, the standard output is used)",
     cxxopts::value<std::string>())
    ("tmpfile", "Temporary file for file-based learner",
     cxxopts::value<std::string>()->default_value("input.tmp"))
    ("subword", "Arguments for subword learner",
     cxxopts::value<std::vector<std::string>>());

  cmd_options.parse_positional("subword");

  auto vm = cmd_options.parse(argc, argv);

  if (vm.count("help"))
  {
    std::cout << cmd_options.help() << std::endl;
    return 0;
  }

  onmt::Tokenizer tokenizer(build_tokenization_options(vm));
  onmt::SubwordLearner *learner;

  const auto subword_args = vm["subword"].as<std::vector<std::string>>();
  const auto& subword = subword_args[0];
  if (subword == "bpe")
  {
    cxxopts::Options bpe_options("subword_learn [OPTION...] -- bpe");
    bpe_options.add_options()
      ("h,help", "Show this help")
      ("s,symbols", "Create this many new symbols (each representing a character n-gram)",
       cxxopts::value<int>()->default_value("10000"))
      ("min-frequency", "Stop if no symbol pair has frequency >= FREQ",
       cxxopts::value<int>()->default_value("2"))
      ("dict-input",
       "If set, input file is interpreted as a dictionary where each line "
       "contains a word-count pair",
       cxxopts::value<bool>()->default_value("false"))
      ("t,total-symbols",
       "Subtract number of characters from the symbols to be generated "
       "(so that '--symbols' becomes an estimate for the total number of "
       "symbols needed to encode text)",
       cxxopts::value<bool>()->default_value("false"))
      ;

    // Parse BPE options only.
    int subargc = subword_args.size();
    char** subargv = new char*[subargc];
    for (int i = 0; i < subargc; ++i)
      subargv[i] = const_cast<char*>(subword_args[i].c_str());
    auto subvm = bpe_options.parse(subargc, subargv);
    delete [] subargv;

    if (subvm.count("help"))
    {
      std::cout << bpe_options.help() << std::endl;
      return 0;
    }

    learner = new onmt::BPELearner(vm["verbose"].as<bool>(),
                                   subvm["symbols"].as<int>(),
                                   subvm["min-frequency"].as<int>(),
                                   subvm["dict-input"].as<bool>(),
                                   subvm["total-symbols"].as<bool>());

  }
  else if (subword == "sentencepiece") {
    learner = new onmt::SentencePieceLearner(vm["verbose"].as<bool>(),
                                             std::vector<std::string>(subword_args.begin() + 1,
                                                                      subword_args.end()),
                                             vm["tmpfile"].as<std::string>());
    return 1;
  }
  else {
    std::cerr << "ERROR: invalid subword type: " << subword << " (accepted: bpe, sentencepiece)" << std::endl;
    return 1;
  }

  if (vm.count("input")) {
    for(const std::string &inputFileName: vm["input"].as<std::vector<std::string> >()) {
      std::cerr << "Parsing " << inputFileName << "..." << std::endl;
      std::ifstream inputFile;
      inputFile.open(inputFileName.c_str());
      inputFile.seekg(0);
      if (inputFile.fail() || !inputFile.good()) {
        std::cout << "ERROR: cannot open file " << inputFileName << " for reading " << std::endl;
        return 1;
      }
      learner->ingest(inputFile, &tokenizer);
    }
  } else
    learner->ingest(std::cin, &tokenizer);

  std::ostream* pCout = &std::cout;
  std::ofstream outputFile;
  if (vm.count("output")) {
    std::string outputFileName = vm["output"].as<std::string>();
    outputFile.open(outputFileName.c_str());
    if (outputFile.fail()) {
      std::cout << "ERROR: cannot open file " << outputFileName << " for writing " << std::endl;
      return 1;
    }
    pCout = &outputFile;
  }
  learner->learn(*pCout, "Generated with subword_learn cli");

  return 0;
}